

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c.c
# Opt level: O2

void microatf_context_validate_expect(microatf_context_t *context)

{
  char *reason;
  int in_EDX;
  int exit_code;
  
  if (microatf_context_static.expect == MICROATF_EXPECT_PASS) {
    return;
  }
  if (microatf_context_static.expect == MICROATF_EXPECT_FAIL) {
    if (microatf_context_static.expect_fail_count !=
        microatf_context_static.expect_previous_fail_count) {
      return;
    }
    reason = "Test case was expecting a failure but none were raised";
  }
  else {
    reason = "Test case continued";
  }
  exit_code = 0x10312e;
  microatf_context_write_result(context,"failed",in_EDX,reason);
  microatf_context_exit((microatf_context_t *)0x1,exit_code);
}

Assistant:

static void
microatf_context_validate_expect(microatf_context_t *context)
{
	if (context->expect == MICROATF_EXPECT_FAIL) {
		if (context->expect_fail_count ==
		    context->expect_previous_fail_count) {
			microatf_context_write_result(context, "failed", -1,
			    "Test case was expecting a failure but none were "
			    "raised");
			microatf_context_exit(context, EXIT_FAILURE);
		}
	} else if (context->expect) {
		microatf_context_write_result(context, "failed", -1,
		    "Test case continued");
		microatf_context_exit(context, EXIT_FAILURE);
	}
}